

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double beta_cdf(double x,double a,double b)

{
  double dVar1;
  
  dVar1 = 0.0;
  if ((0.0 < x) && (dVar1 = 1.0, x <= 1.0)) {
    dVar1 = beta_inc(a,b,x);
    return dVar1;
  }
  return dVar1;
}

Assistant:

double beta_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_CDF evaluates the Beta CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double BETA_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x <= 0.0 )
  {
    cdf = 0.0;
  }
  else if ( x <= 1.0 )
  {
    cdf = beta_inc ( a, b, x );
  }
  else
  {
    cdf = 1.0;
  }

  return cdf;
}